

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usart_linux.c
# Opt level: O3

int csp_usart_open(csp_usart_conf_t *conf,csp_usart_callback_t rx_callback,void *user_data,
                  csp_usart_fd_t *return_fd)

{
  uint32_t uVar1;
  int __fd;
  int iVar2;
  uint __errnum;
  int *piVar3;
  char *pcVar4;
  undefined8 *__arg;
  char *pcVar5;
  char *fmt;
  speed_t __speed;
  pthread_attr_t attributes;
  pthread_attr_t local_a8;
  termios local_70;
  
  if (rx_callback == (csp_usart_callback_t)0x0 && return_fd == (csp_usart_fd_t *)0x0) {
    csp_print_func("%s: No rx_callback function pointer or return_fd pointer provided\n",
                   "csp_usart_open");
    return -2;
  }
  uVar1 = conf->baudrate;
  if ((int)uVar1 < 0x8ca00) {
    if ((int)uVar1 < 0xe100) {
      if ((int)uVar1 < 0x4b00) {
        __speed = 0xc;
        if (uVar1 != 0x12c0) {
          if (uVar1 != 0x2580) {
LAB_0010ca61:
            csp_print_func("%s: Unsupported baudrate: %u\n","csp_usart_open");
            return -2;
          }
          __speed = 0xd;
        }
      }
      else if (uVar1 == 0x4b00) {
        __speed = 0xe;
      }
      else {
        if (uVar1 != 0x9600) goto LAB_0010ca61;
        __speed = 0xf;
      }
    }
    else if ((int)uVar1 < 0x38400) {
      if (uVar1 == 0xe100) {
        __speed = 0x1001;
      }
      else {
        if (uVar1 != 0x1c200) goto LAB_0010ca61;
        __speed = 0x1002;
      }
    }
    else if (uVar1 == 0x38400) {
      __speed = 0x1003;
    }
    else if (uVar1 == 0x70800) {
      __speed = 0x1004;
    }
    else {
      if (uVar1 != 500000) goto LAB_0010ca61;
      __speed = 0x1005;
    }
  }
  else if ((int)uVar1 < 2000000) {
    if ((int)uVar1 < 1000000) {
      if (uVar1 == 0x8ca00) {
        __speed = 0x1006;
      }
      else {
        if (uVar1 != 0xe1000) goto LAB_0010ca61;
        __speed = 0x1007;
      }
    }
    else if (uVar1 == 1000000) {
      __speed = 0x1008;
    }
    else if (uVar1 == 0x119400) {
      __speed = 0x1009;
    }
    else {
      if (uVar1 != 1500000) goto LAB_0010ca61;
      __speed = 0x100a;
    }
  }
  else if ((int)uVar1 < 3000000) {
    if (uVar1 == 2000000) {
      __speed = 0x100b;
    }
    else {
      if (uVar1 != 2500000) goto LAB_0010ca61;
      __speed = 0x100c;
    }
  }
  else if (uVar1 == 3000000) {
    __speed = 0x100d;
  }
  else if (uVar1 == 3500000) {
    __speed = 0x100e;
  }
  else {
    if (uVar1 != 4000000) goto LAB_0010ca61;
    __speed = 0x100f;
  }
  __fd = open(conf->device,0x902);
  if (__fd < 0) {
    pcVar5 = conf->device;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    csp_print_func("%s: failed to open device: [%s], errno: %s\n","csp_usart_open",pcVar5,pcVar4);
    return -2;
  }
  tcgetattr(__fd,&local_70);
  cfsetispeed(&local_70,__speed);
  cfsetospeed(&local_70,__speed);
  local_70.c_cflag = local_70.c_cflag & 0xfffff60f | 0x8b0;
  local_70.c_lflag = local_70.c_lflag & 0xffff7fb4;
  local_70._0_8_ = local_70._0_8_ & 0xffffff82fffffa84;
  local_70.c_cc[5] = '\0';
  local_70.c_cc[6] = '\x01';
  iVar2 = tcsetattr(__fd,0,&local_70);
  if (iVar2 == 0) {
    fcntl(__fd,4,0);
    iVar2 = tcflush(__fd,2);
    if (iVar2 == 0) {
      if (rx_callback == (csp_usart_callback_t)0x0) {
LAB_0010cae9:
        if (return_fd != (csp_usart_fd_t *)0x0) {
          *return_fd = __fd;
          return 0;
        }
        return 0;
      }
      __arg = (undefined8 *)calloc(1,0x20);
      if (__arg == (undefined8 *)0x0) {
        pcVar5 = conf->device;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        csp_print_func("%s: Error allocating context, device: [%s], errno: %s\n","csp_usart_open",
                       pcVar5,pcVar4);
      }
      else {
        *__arg = rx_callback;
        __arg[1] = user_data;
        *(int *)(__arg + 2) = __fd;
        iVar2 = pthread_attr_init(&local_a8);
        if (iVar2 == 0) {
          pthread_attr_setdetachstate(&local_a8,1);
          iVar2 = pthread_create(__arg + 3,&local_a8,usart_rx_thread,__arg);
          if (iVar2 == 0) {
            __errnum = pthread_attr_destroy(&local_a8);
            if (__errnum != 0) {
              pcVar5 = strerror(__errnum);
              csp_print_func("%s: pthread_attr_destroy() failed: %s, errno: %d\n","csp_usart_open",
                             pcVar5,(ulong)__errnum);
            }
            goto LAB_0010cae9;
          }
          pcVar5 = conf->device;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          csp_print_func("%s: pthread_create() failed to create Rx thread for device: [%s], errno: %s\n"
                         ,"csp_usart_open",pcVar5,pcVar4);
        }
        free(__arg);
      }
      close(__fd);
      return -1;
    }
    pcVar5 = conf->device;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fmt = "%s: Error flushing device: [%s], errno: %s\n";
  }
  else {
    pcVar5 = conf->device;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fmt = "%s: Failed to set attributes on device: [%s], errno: %s\n";
  }
  csp_print_func(fmt,"csp_usart_open",pcVar5,pcVar4);
  close(__fd);
  return -0xb;
}

Assistant:

int csp_usart_open(const csp_usart_conf_t * conf, csp_usart_callback_t rx_callback, void * user_data, csp_usart_fd_t * return_fd) {
	if (rx_callback == NULL && return_fd == NULL) {
		csp_print("%s: No rx_callback function pointer or return_fd pointer provided\n", __func__);
		return CSP_ERR_INVAL;
	}

	int brate = 0;
	switch (conf->baudrate) {
		case 4800:
			brate = B4800;
			break;
		case 9600:
			brate = B9600;
			break;
		case 19200:
			brate = B19200;
			break;
		case 38400:
			brate = B38400;
			break;
		case 57600:
			brate = B57600;
			break;
		case 115200:
			brate = B115200;
			break;
		case 230400:
			brate = B230400;
			break;
		case 460800:
			brate = B460800;
			break;
		case 500000:
			brate = B500000;
			break;
		case 576000:
			brate = B576000;
			break;
		case 921600:
			brate = B921600;
			break;
		case 1000000:
			brate = B1000000;
			break;
		case 1152000:
			brate = B1152000;
			break;
		case 1500000:
			brate = B1500000;
			break;
		case 2000000:
			brate = B2000000;
			break;
		case 2500000:
			brate = B2500000;
			break;
		case 3000000:
			brate = B3000000;
			break;
		case 3500000:
			brate = B3500000;
			break;
		case 4000000:
			brate = B4000000;
			break;
		default:
			csp_print("%s: Unsupported baudrate: %u\n", __func__, conf->baudrate);
			return CSP_ERR_INVAL;
	}

	int fd = open(conf->device, O_RDWR | O_NOCTTY | O_NONBLOCK);
	if (fd < 0) {
		csp_print("%s: failed to open device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		return CSP_ERR_INVAL;
	}

	struct termios options;
	tcgetattr(fd, &options);
	cfsetispeed(&options, brate);
	cfsetospeed(&options, brate);
	options.c_cflag |= (CLOCAL | CREAD);
	options.c_cflag &= ~PARENB;
	options.c_cflag &= ~CSTOPB;
	options.c_cflag &= ~CSIZE;
	options.c_cflag |= CS8;
	options.c_lflag &= ~(ECHO | ECHONL | ICANON | IEXTEN | ISIG);
	options.c_iflag &= ~(IGNBRK | BRKINT | ICRNL | INLCR | PARMRK | INPCK | ISTRIP | IXON);
	options.c_oflag &= ~(OCRNL | ONLCR | ONLRET | ONOCR | OFILL | OPOST);
	options.c_cc[VTIME] = 0;
	options.c_cc[VMIN] = 1;
	/* tcsetattr() succeeds if just one attribute was changed, should read back attributes and check all has been changed */
	if (tcsetattr(fd, TCSANOW, &options) != 0) {
		csp_print("%s: Failed to set attributes on device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		close(fd);
		return CSP_ERR_DRIVER;
	}
	fcntl(fd, F_SETFL, 0);

	/* Flush old transmissions */
	if (tcflush(fd, TCIOFLUSH) != 0) {
		csp_print("%s: Error flushing device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		close(fd);
		return CSP_ERR_DRIVER;
	}

	if (rx_callback) {
		usart_context_t * ctx = calloc(1, sizeof(*ctx));
		if (ctx == NULL) {
			csp_print("%s: Error allocating context, device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
			close(fd);
			return CSP_ERR_NOMEM;
		}
		ctx->rx_callback = rx_callback;
		ctx->user_data = user_data;
		ctx->fd = fd;
		int ret;
		pthread_attr_t attributes;

		ret = pthread_attr_init(&attributes);
		if (ret != 0) {
			free(ctx);
			close(fd);
			return CSP_ERR_NOMEM;
		}
		pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
		ret = pthread_create(&ctx->rx_thread, &attributes, usart_rx_thread, ctx);
		if (ret != 0) {
			csp_print("%s: pthread_create() failed to create Rx thread for device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
			free(ctx);
			close(fd);
			return CSP_ERR_NOMEM;
		}
		ret = pthread_attr_destroy(&attributes);
		if (ret != 0) {
			csp_print("%s: pthread_attr_destroy() failed: %s, errno: %d\n", __func__, strerror(ret), ret);
		}
	}

	if (return_fd) {
		*return_fd = fd;
	}

	return CSP_ERR_NONE;
}